

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytevector.c
# Opt level: O0

sexp_conflict str2utf16(sexp_conflict ctx,char *s,int len,sexp_conflict endianness)

{
  uint16_t uVar1;
  int iVar2;
  sexp_conflict psVar3;
  sexp_sint_t sVar4;
  long in_RCX;
  int in_EDX;
  uchar *in_RSI;
  long in_RDI;
  sexp_conflict res;
  sexp_sint_t i;
  sexp_sint_t ch;
  sexp_sint_t ch_len;
  sexp_sint_t utf16_len;
  uint16_t lo;
  uint16_t hi;
  uint16_t *utf16;
  uchar *q;
  uchar *p;
  long local_68;
  long local_50;
  ushort *local_40;
  uchar *local_30;
  
  local_50 = 0;
  for (local_30 = in_RSI; local_30 < in_RSI + in_EDX; local_30 = local_30 + iVar2) {
    iVar2 = sexp_utf8_initial_byte_count(*local_30);
    if ((long)iVar2 == 4) {
      local_50 = local_50 + 1;
    }
    local_50 = local_50 + 1;
  }
  psVar3 = (sexp_conflict)sexp_make_bytes_op(in_RDI,0,2,local_50 << 2 | 1,0x43e);
  if ((((ulong)psVar3 & 3) == 0) && (psVar3->tag == 8)) {
    local_40 = (ushort *)((long)&psVar3->value + 8);
    for (local_30 = in_RSI; local_30 < in_RSI + in_EDX; local_30 = local_30 + iVar2) {
      iVar2 = sexp_utf8_initial_byte_count(*local_30);
      sVar4 = decode_utf8(local_30,iVar2);
      if ((long)iVar2 == 4) {
        *local_40 = (short)(sVar4 >> 10) + 0xd7c0;
        local_40[1] = ((ushort)sVar4 & 0x3ff) + 0xdc00;
        local_40 = local_40 + 2;
      }
      else {
        *local_40 = (ushort)sVar4;
        local_40 = local_40 + 1;
      }
    }
    if (in_RCX != *(long *)(*(long *)(in_RDI + 0x28) + 0x18)) {
      for (local_68 = 0; local_68 < local_50; local_68 = local_68 + 1) {
        uVar1 = sexp_swap_u16(*(uint16_t *)((long)&psVar3->value + local_68 * 2 + 8));
        *(uint16_t *)((long)&psVar3->value + local_68 * 2 + 8) = uVar1;
      }
    }
  }
  return psVar3;
}

Assistant:

sexp str2utf16(sexp ctx, char* s, int len, sexp endianness) {
  unsigned char *p = (unsigned char*) s, *q;
  uint16_t *utf16, hi, lo;
  sexp_sint_t utf16_len, ch_len, ch, i;
  sexp res;
  q = p + len;
  for (utf16_len=0; p<q; ++utf16_len) {
    ch_len = sexp_utf8_initial_byte_count(*p);
    if (ch_len == 4) ++utf16_len;   /* surrogate */
    p += ch_len;
  }
  res = sexp_make_bytes(ctx, sexp_make_fixnum(utf16_len*2), SEXP_VOID);
  if (!sexp_bytesp(res)) return res;
  utf16 = (uint16_t*)sexp_bytes_data(res);
  for (p=(unsigned char*)s; p<q; ) {
    ch_len = sexp_utf8_initial_byte_count(*p);
    ch = decode_utf8(p, ch_len);
    if (ch_len == 4) {
      hi = (0xD800 - (0x10000 >> 10) + ((ch) >> 10));
      lo = (0xDC00 + ((ch) & 0x3FF));
      (*utf16++) = hi;
      (*utf16++) = lo;
    } else {
      (*utf16++) = (uint16_t)ch;
    }
    p += ch_len;
  }
  if (endianness != sexp_global(ctx, SEXP_G_ENDIANNESS)) {
    utf16 = (uint16_t*)sexp_bytes_data(res);
    for (i=0; i<utf16_len; ++i) {
      utf16[i] = sexp_swap_u16(utf16[i]);
    }
  }
  return res;
}